

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O0

size_t i2p_dest_sigsize(i2p_privkeybuf *priv)

{
  i2p_privkeybuf *priv_local;
  size_t local_8;
  
  if (priv->sigtype == 0) {
    local_8 = 0x80;
  }
  else if (priv->sigtype == 7) {
    local_8 = 0x40;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t i2p_dest_sigsize(struct i2p_privkeybuf * priv)
{
  switch(priv->sigtype)
  {
  case EDDSA_KEYTYPE:
    return 64;
  case DSA_KEYTYPE:
    return 128;
  default:
    return 0;
  }
}